

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

int AF_AActor_Teleport(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  double a;
  double b;
  AActor *thing;
  bool bVar1;
  bool local_8b;
  TAngle<double> local_88;
  TVector3<double> local_80;
  uint local_68;
  int local_64;
  int u;
  int flags;
  DAngle an;
  double z;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf3,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf3,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  thing = (AActor *)(param->field_0).field_1.a;
  local_8b = true;
  if (thing != (AActor *)0x0) {
    local_8b = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
  }
  if (local_8b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf3,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf4,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf4,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  a = param[1].field_0.f;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf5,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf5,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  b = param[2].field_0.f;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf6,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf6,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  an.Degrees = *(double *)&param[3].field_0;
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf7,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[4].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf7,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle((TAngle<double> *)&u,param[4].field_0.f);
  if (numparam < 6) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf8,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[5].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf8,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  local_64 = param[5].field_0.i;
  TVector3<double>::TVector3(&local_80,a,b,an.Degrees);
  TAngle<double>::TAngle(&local_88,(TAngle<double> *)&u);
  bVar1 = P_Teleport(thing,&local_80,&local_88,local_64);
  local_68 = (uint)bVar1;
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                    ,0xf9,
                    "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,local_68);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Teleport)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_ANGLE(an);
	PARAM_INT(flags);
	ACTION_RETURN_BOOL(P_Teleport(self, DVector3(x, y, z), an, flags));
}